

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field_test.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::MapFieldStateTest_SpaceUsedExcludingSelf_Test::
~MapFieldStateTest_SpaceUsedExcludingSelf_Test(MapFieldStateTest_SpaceUsedExcludingSelf_Test *this)

{
  ~MapFieldStateTest_SpaceUsedExcludingSelf_Test
            ((MapFieldStateTest_SpaceUsedExcludingSelf_Test *)
             &this[-1].super_MapFieldStateTest.map_field_base_);
  return;
}

Assistant:

TEST_P(MapFieldStateTest, SpaceUsedExcludingSelf) {
  map_field_base_->SpaceUsedExcludingSelf();

  switch (state_) {
    case CLEAN:
      Expect(map_field_.get(), CLEAN, 1, 1);
      break;
    case MAP_DIRTY:
      Expect(map_field_.get(), MAP_DIRTY, 1, 0);
      break;
    case REPEATED_DIRTY:
      Expect(map_field_.get(), REPEATED_DIRTY, 0, 1);
      break;
    default:
      break;
  }
}